

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O0

size_t __thiscall
Logger::logful<unsigned_long>
          (Logger *this,logful_context_t *ctx,uint8_t **pOut,char **pMsg,unsigned_long t)

{
  uint8_t *__s;
  char *pcVar1;
  size_t __n;
  long lVar2;
  int local_44;
  int flen;
  size_t sglen;
  char *nTok;
  unsigned_long t_local;
  char **pMsg_local;
  uint8_t **pOut_local;
  logful_context_t *ctx_local;
  Logger *this_local;
  
  pcVar1 = findNextToken('%',';',&ctx->tokenFormat,*pMsg);
  __n = (long)pcVar1 - (long)*pMsg;
  memcpy(*pOut,*pMsg,__n);
  lVar2 = std::__cxx11::string::size();
  *pMsg = *pMsg + __n + lVar2 + 1;
  *pOut = *pOut + __n;
  local_44 = 0;
  if (pcVar1 != (char *)0x0) {
    __s = *pOut;
    pcVar1 = (char *)std::__cxx11::string::c_str();
    local_44 = sprintf((char *)__s,pcVar1,t);
  }
  if (0 < local_44) {
    *pOut = *pOut + local_44;
  }
  return __n + (long)local_44;
}

Assistant:

size_t logful(logful_context_t& ctx, uint8_t*& pOut, const char*& pMsg, T t)
    {
        const char *nTok = findNextToken('%', ';', ctx.tokenFormat,pMsg);
        size_t sglen = uintptr_t(nTok)-uintptr_t(pMsg);
        std::memcpy(pOut, pMsg, sglen);
        pMsg += sglen + ctx.tokenFormat.size() + 1;
        pOut += sglen;
        int flen = 0;
        // std::cout << "logful(T) nTok=" << uintptr_t(nTok) << " sglen=" << sglen << "\n";

        if (nTok)
        {
            if constexpr (!std::is_same_v<T, BufferLog>)
            {
                flen = std::sprintf((char*)pOut, ctx.tokenFormat.c_str(), t);
                // std::cout << "token: " << "format: " << ctx.tokenFormat.c_str() <<  " value: " << t <<  " formatted: \"" << pOut << "\"\n";
            }
            else
            {
                auto s = toHexString((uint8_t*)t.second, t.first);
                std::memcpy(pOut, s.data(), s.size());
                flen += s.size();
            }
        }
        if (flen>0) pOut += flen;
        return sglen + flen;
    }